

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_codes_writer.c
# Opt level: O2

void aom_write_primitive_refsubexpfin(aom_writer *w,uint16_t n,uint16_t k,uint16_t ref,uint16_t v)

{
  uint16_t uVar1;
  int iVar2;
  int bits;
  undefined6 in_register_00000012;
  int iVar3;
  uint uVar4;
  int iVar5;
  undefined6 in_register_00000032;
  int iVar6;
  int iVar7;
  
  iVar2 = (int)CONCAT62(in_register_00000012,k);
  iVar5 = (int)CONCAT62(in_register_00000032,n);
  uVar1 = recenter_finite_nonneg(n,ref,v);
  iVar3 = 0;
  iVar7 = 0;
  while( true ) {
    iVar6 = iVar7;
    bits = iVar3 + iVar2 + -1;
    if (iVar3 == 0) {
      bits = iVar2;
    }
    if (iVar5 <= (3 << ((byte)bits & 0x1f)) + iVar6) break;
    iVar7 = (1 << ((byte)bits & 0x1f)) + iVar6;
    uVar4 = (uint)uVar1;
    aom_write_bit(w,(uint)(iVar7 <= (int)uVar4));
    iVar3 = iVar3 + 1;
    if ((int)uVar4 < iVar7) {
      uVar4 = uVar4 - iVar6;
LAB_002528e6:
      aom_write_literal(w,uVar4,bits);
      return;
    }
  }
  uVar4 = iVar5 - iVar6;
  if ((ushort)uVar4 < 2) {
    return;
  }
  uVar4 = uVar4 & 0xffff;
  bits = 0x1f;
  if (uVar4 != 0) {
    for (; uVar4 >> bits == 0; bits = bits + -1) {
    }
  }
  iVar2 = (2 << ((byte)bits & 0x1f)) - uVar4;
  uVar4 = (uint)uVar1 - iVar6 & 0xffff;
  if (iVar2 <= (int)uVar4) {
    aom_write_literal(w,((int)(uVar4 - iVar2) >> 1) + iVar2,bits);
    aom_write_bit(w,uVar4 - iVar2 & 1);
    return;
  }
  goto LAB_002528e6;
}

Assistant:

void aom_write_primitive_refsubexpfin(aom_writer *w, uint16_t n, uint16_t k,
                                      uint16_t ref, uint16_t v) {
  write_primitive_subexpfin(w, n, k, recenter_finite_nonneg(n, ref, v));
}